

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::
ExtensionDeclarationsTest_MismatchCardinalityExpectingRepeated_Test::
~ExtensionDeclarationsTest_MismatchCardinalityExpectingRepeated_Test
          (ExtensionDeclarationsTest_MismatchCardinalityExpectingRepeated_Test *this)

{
  ~ExtensionDeclarationsTest_MismatchCardinalityExpectingRepeated_Test
            ((ExtensionDeclarationsTest_MismatchCardinalityExpectingRepeated_Test *)
             &this[-1].super_ExtensionDeclarationsTest.super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(ExtensionDeclarationsTest, MismatchCardinalityExpectingRepeated) {
  absl::StatusOr<FileDescriptorProto> file_proto = ParameterizeFileProto(
      R"pb(
        name: "foo.proto"
        package: "ext.test"
        message_type {
          name: "Foo"
          extension_range {
            start: 10
            end: 11
            options: {
              declaration: {
                number: 10
                full_name: ".ext.test.bar"
                type: "fixed64"
                repeated: true
              }
            }
          }
        }
        extension { name: "bar" number: 10 type: TYPE_FIXED64 extendee: "Foo" }
      )pb",
      GetParam());
  ASSERT_OK(file_proto);

  DescriptorPool pool;
  pool.EnforceExtensionDeclarations(ExtDeclEnforcementLevel::kAllExtensions);
  MockErrorCollector error_collector;
  EXPECT_EQ(pool.BuildFileCollectingErrors(*file_proto, &error_collector),
            nullptr);
  EXPECT_EQ(error_collector.text_,
            "foo.proto: ext.test.bar: EXTENDEE: \"ext.test.Foo\" extension "
            "field 10 is expected to be repeated.\n");
}